

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall pbrt::BilinearPatch::Sample(BilinearPatch *this,Point2f u)

{
  Vector3<float> v_00;
  Vector3<float> v_01;
  Vector3<float> v_02;
  Point3<float> p_00;
  Point2f uv_00;
  Tuple2<pbrt::Point2,_float> t1;
  Tuple2<pbrt::Point2,_float> t1_00;
  Tuple2<pbrt::Point2,_float> t1_01;
  Point3<float> p_01;
  Point3<float> p_02;
  Point3<float> p_03;
  Point3<float> p_04;
  Point3<float> p_05;
  Point3<float> p_06;
  Point3<float> p_07;
  Point3<float> p_08;
  Point3<float> p_09;
  Tuple3<pbrt::Point3,_float> t;
  Tuple3<pbrt::Point3,_float> t_00;
  Point3<float> c;
  Tuple3<pbrt::Point3,_float> t_01;
  Point3<float> c_00;
  Tuple3<pbrt::Point3,_float> t_02;
  Point3<float> c_01;
  Vector3<float> w_00;
  Vector3<float> w_01;
  Vector3<float> w_02;
  Vector3<float> w_03;
  Vector3<float> w_04;
  Tuple2<pbrt::Point2,_float> t0;
  Tuple2<pbrt::Point2,_float> t0_00;
  Tuple2<pbrt::Point2,_float> t0_01;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Vector3<float> v_05;
  Vector3<float> v_06;
  Tuple3<pbrt::Vector3,_float> t_03;
  Vector3f e;
  Normal3f n_00;
  Vector3<float> v_07;
  undefined1 auVar1 [16];
  initializer_list<float> v_08;
  span<const_float> w_05;
  Vector3<float> v_09;
  Vector3<float> v_10;
  Vector3<float> v_11;
  Vector3<float> v_12;
  Vector3<float> v_13;
  Vector3<float> v_14;
  Vector3<float> v_15;
  Point3f p_10;
  Point2f p_11;
  span<const_float> w_06;
  Point2f u_00;
  Normal3<float> n_01;
  Tuple3<pbrt::Point3,_float> t1_02;
  Tuple3<pbrt::Point3,_float> t1_03;
  Tuple3<pbrt::Point3,_float> t1_04;
  Tuple3<pbrt::Point3,_float> t1_05;
  Tuple3<pbrt::Point3,_float> t1_06;
  Tuple3<pbrt::Normal3,_float> t1_07;
  Tuple3<pbrt::Normal3,_float> t1_08;
  Tuple3<pbrt::Normal3,_float> t1_09;
  Tuple3<pbrt::Point3,_float> t0_02;
  Tuple3<pbrt::Point3,_float> t0_03;
  Tuple3<pbrt::Point3,_float> t0_04;
  Tuple3<pbrt::Point3,_float> t0_05;
  Tuple3<pbrt::Point3,_float> t0_06;
  Tuple3<pbrt::Normal3,_float> t0_07;
  Tuple3<pbrt::Normal3,_float> t0_08;
  Tuple3<pbrt::Normal3,_float> t0_09;
  bool bVar2;
  Point3f *pPVar3;
  float *pfVar4;
  long in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  float fVar5;
  undefined4 uVar6;
  type tVar7;
  double dVar8;
  undefined8 uVar48;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [64];
  undefined1 auVar49 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  Point3<float> PVar50;
  Vector3<float> VVar51;
  Normal3<float> NVar52;
  Vector3f pError;
  Point3f pAbsSum;
  Normal3f ns;
  Normal3f n11;
  Normal3f n01;
  Normal3f n10;
  Normal3f n00;
  Normal3f n;
  Point2f uv11;
  Point2f uv01;
  Point2f uv10;
  Point2f uv00;
  Point2f st;
  Vector3f dpdv;
  Vector3f dpdu;
  Point3f p;
  Point3f pu1;
  Point3f pu0;
  array<float,_4> w;
  Point2f uv;
  Float pdf;
  Point3f p11;
  Point3f p01;
  Point3f p10;
  Point3f p00;
  int *v;
  BilinearPatchMesh *mesh;
  ShapeSample *in_stack_fffffffffffff278;
  undefined4 in_stack_fffffffffffff280;
  undefined4 in_stack_fffffffffffff284;
  undefined4 in_stack_fffffffffffff288;
  undefined4 in_stack_fffffffffffff28c;
  Interaction *this_00;
  float in_stack_fffffffffffff290;
  float in_stack_fffffffffffff294;
  Float FVar53;
  undefined8 in_stack_fffffffffffff298;
  Tuple2<pbrt::Point2,_float> *pTVar54;
  float in_stack_fffffffffffff2a0;
  float in_stack_fffffffffffff2a4;
  float in_stack_fffffffffffff2a8;
  float in_stack_fffffffffffff2ac;
  float in_stack_fffffffffffff2b0;
  undefined4 in_stack_fffffffffffff2b4;
  iterator in_stack_fffffffffffff2b8;
  Tuple2<pbrt::Point2,_float> *in_stack_fffffffffffff2c0;
  float in_stack_fffffffffffff2c8;
  float in_stack_fffffffffffff2cc;
  float in_stack_fffffffffffff2d0;
  undefined4 in_stack_fffffffffffff2d4;
  int iVar55;
  Float *in_stack_fffffffffffff2d8;
  undefined4 in_stack_fffffffffffff2e0;
  undefined4 in_stack_fffffffffffff2e4;
  float in_stack_fffffffffffff2e8;
  float in_stack_fffffffffffff2ec;
  Tuple2<pbrt::Point2,_float> u_01;
  undefined1 *in_stack_fffffffffffff300;
  float fVar56;
  undefined4 uStack_cf4;
  undefined8 in_stack_fffffffffffff320;
  Float t_04;
  undefined4 in_stack_fffffffffffff338;
  undefined4 in_stack_fffffffffffff33c;
  float in_stack_fffffffffffff340;
  undefined4 in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff35c;
  float in_stack_fffffffffffff360;
  Interaction local_c08;
  float local_ba0;
  undefined8 local_b98;
  float local_b90;
  undefined8 local_b88;
  undefined4 local_b80;
  undefined8 local_b78;
  float local_b70;
  undefined8 local_b68;
  float local_b60;
  undefined8 local_b5c;
  undefined4 local_b54;
  undefined8 local_b50;
  undefined4 local_b48;
  undefined8 local_b40;
  float local_b38;
  undefined8 local_b30;
  float local_b28;
  undefined8 local_b20;
  float local_b18;
  undefined8 local_b10;
  float local_b08;
  undefined8 local_b00;
  float local_af8;
  undefined8 local_af0;
  float local_ae8;
  undefined8 local_ae0;
  float local_ad8;
  undefined8 local_ad0;
  float local_ac8;
  undefined8 local_ac0;
  float local_ab8;
  undefined8 local_ab0;
  float local_aa8;
  undefined8 local_aa0;
  float local_a98;
  undefined8 local_a90;
  float local_a88;
  undefined8 local_a80;
  float local_a78;
  undefined8 local_a70;
  float local_a68;
  undefined8 local_a60;
  float local_a58;
  undefined8 local_a50;
  float local_a48;
  undefined8 local_a40;
  float local_a38;
  undefined8 local_a30;
  float local_a28;
  undefined8 local_a20;
  float local_a18;
  undefined8 local_a10;
  float local_a08;
  undefined8 local_a00;
  float local_9f8;
  undefined8 local_9f0;
  float local_9e8;
  undefined8 local_9e0;
  float local_9d8;
  undefined8 local_9d0;
  float local_9c8;
  undefined8 local_9c0;
  float local_9b8;
  undefined8 local_9b0;
  float local_9a8;
  undefined8 local_9a0;
  float local_998;
  undefined8 local_98c;
  float local_984;
  undefined8 local_980;
  float local_978;
  undefined8 local_970;
  float local_968;
  undefined8 local_950;
  float local_948;
  undefined8 local_934;
  float local_92c;
  undefined8 local_928;
  undefined4 in_stack_fffffffffffff6e0;
  undefined4 in_stack_fffffffffffff6e4;
  BilinearPatch *in_stack_fffffffffffff6e8;
  type local_a8;
  type local_a4;
  type local_a0;
  type local_9c;
  type *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  Tuple2<pbrt::Point2,_float> local_78;
  Tuple2<pbrt::Point2,_float> local_70;
  Tuple2<pbrt::Point2,_float> local_68;
  Float local_5c;
  undefined8 local_58;
  float local_50;
  undefined8 local_4c;
  float local_44;
  undefined8 local_40;
  float local_38;
  undefined8 local_34;
  float local_2c;
  int *local_28;
  BilinearPatchMesh *local_20;
  Tuple2<pbrt::Point2,_float> local_10;
  undefined1 auVar23 [64];
  undefined1 auVar26 [64];
  undefined1 auVar35 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  FVar53 = (Float)((ulong)in_stack_fffffffffffff298 >> 0x20);
  t_04 = (Float)((ulong)in_stack_fffffffffffff320 >> 0x20);
  fVar56 = SUB84(in_RDI,0);
  uStack_cf4 = (undefined4)((ulong)in_RDI >> 0x20);
  local_10 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_20 = GetMesh((BilinearPatch *)0x5841c8);
  local_28 = local_20->vertexIndices + (*(int *)(in_RSI + 4) << 2);
  pPVar3 = local_20->p + *local_28;
  local_34._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_34._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_2c = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  pPVar3 = local_20->p + local_28[1];
  local_40._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_40._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_38 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  pPVar3 = local_20->p + local_28[2];
  local_4c._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_4c._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_44 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  pPVar3 = local_20->p + local_28[3];
  local_58._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
  local_58._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
  local_50 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
  local_5c = 1.0;
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
  if (local_20->imageDistribution == (PiecewiseConstant2D *)0x0) {
    bVar2 = IsRectangle(in_stack_fffffffffffff6e8,
                        (BilinearPatchMesh *)
                        CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    u_01.y = 0.0;
    u_01.x = in_stack_fffffffffffff2e8;
    if (bVar2) {
      local_68 = local_10;
    }
    else {
      auVar49 = ZEXT856(0);
      u_01 = (Tuple2<pbrt::Point2,_float>)&local_40;
      PVar50.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      PVar50.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      PVar50.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),PVar50);
      auVar10._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar49;
      vmovlpd_avx(auVar10._0_16_);
      auVar49 = ZEXT856(0);
      p_01.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_01.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_01);
      auVar11._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar49;
      vmovlpd_avx(auVar11._0_16_);
      auVar49 = ZEXT856(0);
      v_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_09.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      VVar51.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      VVar51.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      VVar51.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      VVar51 = Cross<float>(v_09,VVar51);
      auVar12._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar49;
      vmovlpd_avx(auVar12._0_16_);
      v_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      v_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      v_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      local_a8 = Length<float>(v_03);
      auVar49 = ZEXT856(0);
      p_02.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_02.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_02);
      auVar13._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar49;
      vmovlpd_avx(auVar13._0_16_);
      auVar49 = ZEXT856(0);
      p_03.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_03.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_03.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_03);
      auVar14._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14._8_56_ = auVar49;
      vmovlpd_avx(auVar14._0_16_);
      auVar49 = ZEXT856(0);
      v_10.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      w_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      VVar51 = Cross<float>(v_10,w_00);
      auVar15._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar15._8_56_ = auVar49;
      vmovlpd_avx(auVar15._0_16_);
      v_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      v_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      v_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      local_a4 = Length<float>(v_04);
      auVar49 = ZEXT856(0);
      p_04.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_04.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_04.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_04);
      auVar16._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar16._8_56_ = auVar49;
      vmovlpd_avx(auVar16._0_16_);
      auVar49 = ZEXT856(0);
      p_05.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_05.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_05.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_05);
      auVar17._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar17._8_56_ = auVar49;
      vmovlpd_avx(auVar17._0_16_);
      auVar49 = ZEXT856(0);
      v_11.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_11.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      w_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      w_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      w_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      VVar51 = Cross<float>(v_11,w_01);
      auVar18._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar18._8_56_ = auVar49;
      vmovlpd_avx(auVar18._0_16_);
      v_05.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      v_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      v_05.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      local_a0 = Length<float>(v_05);
      auVar49 = ZEXT856(0);
      p_06.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_06.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_06.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_06);
      auVar19._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar19._8_56_ = auVar49;
      vmovlpd_avx(auVar19._0_16_);
      auVar49 = ZEXT856(0);
      p_07.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      p_07.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      p_07.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      VVar51 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),p_07);
      auVar20._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar20._8_56_ = auVar49;
      vmovlpd_avx(auVar20._0_16_);
      auVar49 = ZEXT856(0);
      v_12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_12.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      w_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      w_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      w_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      VVar51 = Cross<float>(v_12,w_02);
      auVar21._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar21._8_56_ = auVar49;
      vmovlpd_avx(auVar21._0_16_);
      v_06.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      v_06.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      v_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      local_9c = Length<float>(v_06);
      local_98 = &local_a8;
      local_90 = 4;
      in_stack_fffffffffffff300 = local_88;
      v_08._M_len = (size_type)in_stack_fffffffffffff2c0;
      v_08._M_array = in_stack_fffffffffffff2b8;
      pstd::array<float,_4>::array
                ((array<float,_4> *)CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
                 v_08);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 (array<float,_4> *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      w_06.n._0_4_ = in_stack_fffffffffffff2e0;
      w_06.ptr = in_stack_fffffffffffff2d8;
      w_06.n._4_4_ = in_stack_fffffffffffff2e4;
      auVar22._0_8_ = SampleBilinear(u_01,w_06);
      auVar22._8_56_ = extraout_var_00;
      local_68 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar22._0_16_);
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                 (array<float,_4> *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288));
      p_11.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff2d0;
      p_11.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff2cc;
      w_05.n = (size_t)in_stack_fffffffffffff2c0;
      w_05.ptr = in_stack_fffffffffffff2b8;
      local_5c = BilinearPDF(p_11,w_05);
    }
  }
  else {
    local_78 = local_10;
    u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff2ec;
    u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff2e8;
    auVar9._0_8_ = PiecewiseConstant2D::Sample
                             ((PiecewiseConstant2D *)
                              CONCAT44(in_stack_fffffffffffff2e4,in_stack_fffffffffffff2e0),u_00,
                              in_stack_fffffffffffff2d8,
                              (Point2i *)
                              CONCAT44(in_stack_fffffffffffff2d4,in_stack_fffffffffffff2d0));
    u_01.y = 0.0;
    u_01.x = in_stack_fffffffffffff2e8;
    auVar9._8_56_ = extraout_var;
    local_70 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
    local_68 = local_70;
  }
  pTVar54 = &local_68;
  iVar55 = 1;
  Tuple2<pbrt::Point2,_float>::operator[](pTVar54,1);
  auVar49 = (undefined1  [56])0x0;
  t0_02.y = (float)in_stack_fffffffffffff35c;
  t0_02.x = (float)in_stack_fffffffffffff358;
  t0_02.z = in_stack_fffffffffffff360;
  t1_02.y = (float)in_stack_fffffffffffff33c;
  t1_02.x = (float)in_stack_fffffffffffff338;
  t1_02.z = in_stack_fffffffffffff340;
  PVar50 = Lerp<pbrt::Point3,float>(t_04,t0_02,t1_02);
  auVar23._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = auVar49;
  vmovlpd_avx(auVar23._0_16_);
  Tuple2<pbrt::Point2,_float>::operator[](pTVar54,iVar55);
  auVar49 = (undefined1  [56])0x0;
  t0_03.y = (float)in_stack_fffffffffffff35c;
  t0_03.x = (float)in_stack_fffffffffffff358;
  t0_03.z = in_stack_fffffffffffff360;
  t1_03.y = (float)in_stack_fffffffffffff33c;
  t1_03.x = (float)in_stack_fffffffffffff338;
  t1_03.z = in_stack_fffffffffffff340;
  PVar50 = Lerp<pbrt::Point3,float>(t_04,t0_03,t1_03);
  auVar24._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar24._8_56_ = auVar49;
  vmovlpd_avx(auVar24._0_16_);
  iVar55 = 0;
  Tuple2<pbrt::Point2,_float>::operator[](pTVar54,0);
  auVar49 = (undefined1  [56])0x0;
  t0_04.y = (float)in_stack_fffffffffffff35c;
  t0_04.x = (float)in_stack_fffffffffffff358;
  t0_04.z = in_stack_fffffffffffff360;
  t1_04.y = (float)in_stack_fffffffffffff33c;
  t1_04.x = (float)in_stack_fffffffffffff338;
  t1_04.z = in_stack_fffffffffffff340;
  PVar50 = Lerp<pbrt::Point3,float>(t_04,t0_04,t1_04);
  auVar25._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar25._8_56_ = auVar49;
  vmovlpd_avx(auVar25._0_16_);
  auVar49 = ZEXT856(0);
  p_08.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
  p_08.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
  p_08.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
  VVar51 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)
                      ,p_08);
  auVar26._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = auVar49;
  vmovlpd_avx(auVar26._0_16_);
  Tuple2<pbrt::Point2,_float>::operator[](pTVar54,iVar55);
  auVar49 = (undefined1  [56])0x0;
  t0_05.y = (float)in_stack_fffffffffffff35c;
  t0_05.x = (float)in_stack_fffffffffffff358;
  t0_05.z = in_stack_fffffffffffff360;
  t1_05.y = (float)in_stack_fffffffffffff33c;
  t1_05.x = (float)in_stack_fffffffffffff338;
  t1_05.z = in_stack_fffffffffffff340;
  PVar50 = Lerp<pbrt::Point3,float>(t_04,t0_05,t1_05);
  auVar27._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar27._8_56_ = auVar49;
  vmovlpd_avx(auVar27._0_16_);
  Tuple2<pbrt::Point2,_float>::operator[](pTVar54,iVar55);
  auVar49 = (undefined1  [56])0x0;
  t0_06.y = (float)in_stack_fffffffffffff35c;
  t0_06.x = (float)in_stack_fffffffffffff358;
  t0_06.z = in_stack_fffffffffffff360;
  t1_06.y = (float)in_stack_fffffffffffff33c;
  t1_06.x = (float)in_stack_fffffffffffff338;
  t1_06.z = in_stack_fffffffffffff340;
  PVar50 = Lerp<pbrt::Point3,float>(t_04,t0_06,t1_06);
  auVar28._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar28._8_56_ = auVar49;
  vmovlpd_avx(auVar28._0_16_);
  auVar49 = ZEXT856(0);
  p_09.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
  p_09.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
  p_09.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
  VVar51 = Point3<float>::operator-
                     ((Point3<float> *)CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288)
                      ,p_09);
  auVar29._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._8_56_ = auVar49;
  vmovlpd_avx(auVar29._0_16_);
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff290;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff28c;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff294;
  fVar5 = LengthSquared<float>(v_00);
  if ((fVar5 != 0.0) || (NAN(fVar5))) {
    v_01.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff290;
    v_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff28c;
    v_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff294;
    fVar5 = LengthSquared<float>(v_01);
    if ((fVar5 != 0.0) || (NAN(fVar5))) {
      if (local_20->uv != (Point2f *)0x0) {
        in_stack_fffffffffffff2c0 = &local_68;
        pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](in_stack_fffffffffffff2c0,0);
        in_stack_fffffffffffff2d0 = *pfVar4;
        in_stack_fffffffffffff2cc = 1.4013e-45;
        Tuple2<pbrt::Point2,_float>::operator[](in_stack_fffffffffffff2c0,1);
        t0.y = in_stack_fffffffffffff2ac;
        t0.x = in_stack_fffffffffffff2a8;
        t1.y = in_stack_fffffffffffff2a4;
        t1.x = in_stack_fffffffffffff2a0;
        auVar30._0_8_ = Lerp<pbrt::Point2,float>(FVar53,t0,t1);
        auVar30._8_56_ = extraout_var_01;
        vmovlpd_avx(auVar30._0_16_);
        Tuple2<pbrt::Point2,_float>::operator[]
                  (in_stack_fffffffffffff2c0,(int)in_stack_fffffffffffff2cc);
        t0_00.y = in_stack_fffffffffffff2ac;
        t0_00.x = in_stack_fffffffffffff2a8;
        t1_00.y = in_stack_fffffffffffff2a4;
        t1_00.x = in_stack_fffffffffffff2a0;
        auVar31._0_8_ = Lerp<pbrt::Point2,float>(FVar53,t0_00,t1_00);
        auVar31._8_56_ = extraout_var_02;
        vmovlpd_avx(auVar31._0_16_);
        t0_01.y = in_stack_fffffffffffff2ac;
        t0_01.x = in_stack_fffffffffffff2a8;
        t1_01.y = in_stack_fffffffffffff2a4;
        t1_01.x = in_stack_fffffffffffff2a0;
        auVar32._0_8_ = Lerp<pbrt::Point2,float>(FVar53,t0_01,t1_01);
        auVar32._8_56_ = extraout_var_03;
        vmovlpd_avx(auVar32._0_16_);
      }
      auVar49 = ZEXT856(0);
      v_13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_13.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      w_03.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      w_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      w_03.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      VVar51 = Cross<float>(v_13,w_03);
      auVar33._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar33._8_56_ = auVar49;
      vmovlpd_avx(auVar33._0_16_);
      auVar49 = ZEXT856(0);
      v_15.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2cc;
      v_15.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2c8;
      v_15.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2d0;
      VVar51 = Normalize<float>(v_15);
      auVar34._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar34._8_56_ = auVar49;
      vmovlpd_avx(auVar34._0_16_);
      auVar49 = (undefined1  [56])0x0;
      v_02.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff290;
      v_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff28c;
      v_02.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff294;
      Normal3<float>::Normal3<float>((Normal3<float> *)0x5855b8,v_02);
      if (local_20->n == (Normal3f *)0x0) {
        if ((local_20->reverseOrientation & 1U) != (local_20->transformSwapsHandedness & 1U)) {
          NVar52 = Tuple3<pbrt::Normal3,_float>::operator-
                             ((Tuple3<pbrt::Normal3,_float> *)
                              CONCAT44(in_stack_fffffffffffff284,in_stack_fffffffffffff280));
          local_998 = NVar52.super_Tuple3<pbrt::Normal3,_float>.z;
          auVar38._0_8_ = NVar52.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar38._8_56_ = auVar49;
          local_9a0 = vmovlpd_avx(auVar38._0_16_);
          local_98c = local_9a0;
          local_984 = local_998;
        }
      }
      else {
        pTVar54 = &local_68;
        pfVar4 = Tuple2<pbrt::Point2,_float>::operator[](pTVar54,0);
        in_stack_fffffffffffff2a4 = *pfVar4;
        in_stack_fffffffffffff2a0 = 1.4013e-45;
        Tuple2<pbrt::Point2,_float>::operator[](pTVar54,1);
        auVar49 = (undefined1  [56])0x0;
        t0_07.y = (float)in_stack_fffffffffffff35c;
        t0_07.x = (float)in_stack_fffffffffffff358;
        t0_07.z = in_stack_fffffffffffff360;
        t1_07.y = (float)in_stack_fffffffffffff33c;
        t1_07.x = (float)in_stack_fffffffffffff338;
        t1_07.z = in_stack_fffffffffffff340;
        NVar52 = Lerp<pbrt::Normal3,float>(t_04,t0_07,t1_07);
        auVar35._0_8_ = NVar52.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar35._8_56_ = auVar49;
        vmovlpd_avx(auVar35._0_16_);
        Tuple2<pbrt::Point2,_float>::operator[](pTVar54,(int)in_stack_fffffffffffff2a0);
        uVar48 = 0;
        t0_08.y = (float)in_stack_fffffffffffff35c;
        t0_08.x = (float)in_stack_fffffffffffff358;
        t0_08.z = in_stack_fffffffffffff360;
        t1_08.y = (float)in_stack_fffffffffffff33c;
        t1_08.x = (float)in_stack_fffffffffffff338;
        t1_08.z = in_stack_fffffffffffff340;
        NVar52 = Lerp<pbrt::Normal3,float>(t_04,t0_08,t1_08);
        auVar49 = (undefined1  [56])0x0;
        in_stack_fffffffffffff2a8 = NVar52.super_Tuple3<pbrt::Normal3,_float>.x;
        in_stack_fffffffffffff2ac = NVar52.super_Tuple3<pbrt::Normal3,_float>.y;
        in_stack_fffffffffffff2b0 = (float)uVar48;
        auVar1._8_4_ = in_stack_fffffffffffff2b0;
        auVar1._0_8_ = NVar52.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar1._12_4_ = (int)((ulong)uVar48 >> 0x20);
        vmovlpd_avx(auVar1);
        t0_09.y = (float)in_stack_fffffffffffff35c;
        t0_09.x = (float)in_stack_fffffffffffff358;
        t0_09.z = in_stack_fffffffffffff360;
        t1_09.y = (float)in_stack_fffffffffffff33c;
        t1_09.x = (float)in_stack_fffffffffffff338;
        t1_09.z = in_stack_fffffffffffff340;
        NVar52 = Lerp<pbrt::Normal3,float>(t_04,t0_09,t1_09);
        local_968 = NVar52.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar36._0_8_ = NVar52.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar36._8_56_ = auVar49;
        local_970 = vmovlpd_avx(auVar36._0_16_);
        auVar49 = ZEXT856(0);
        n_01.super_Tuple3<pbrt::Normal3,_float>.z = fVar56;
        n_01.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_fffffffffffff300;
        NVar52.super_Tuple3<pbrt::Normal3,_float>.y = (float)iVar55;
        NVar52.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff2e0;
        NVar52.super_Tuple3<pbrt::Normal3,_float>.z = u_01.x;
        local_950 = local_970;
        local_948 = local_968;
        local_928 = local_970;
        NVar52 = FaceForward<float>(n_01,NVar52);
        local_978 = NVar52.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar37._0_8_ = NVar52.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar37._8_56_ = auVar49;
        local_980 = vmovlpd_avx(auVar37._0_16_);
        local_934 = local_980;
        local_92c = local_978;
      }
      local_9e8 = local_2c;
      local_9f0 = local_34;
      local_9f8 = local_2c;
      local_a00 = local_34;
      auVar49 = ZEXT856(0);
      t.y = in_stack_fffffffffffff2a4;
      t.x = in_stack_fffffffffffff2a0;
      t.z = in_stack_fffffffffffff2a8;
      PVar50 = Abs<pbrt::Point3,float>(t);
      local_a08 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar39._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar39._8_56_ = auVar49;
      local_a10 = vmovlpd_avx(auVar39._0_16_);
      local_a28 = local_44;
      local_a30 = local_4c;
      local_a38 = local_44;
      local_a40 = local_4c;
      auVar49 = ZEXT856(0);
      t_00.y = in_stack_fffffffffffff2a4;
      t_00.x = in_stack_fffffffffffff2a0;
      t_00.z = in_stack_fffffffffffff2a8;
      local_9e0 = local_a10;
      local_9d8 = local_a08;
      PVar50 = Abs<pbrt::Point3,float>(t_00);
      local_a58 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar40._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar40._8_56_ = auVar49;
      local_a60 = vmovlpd_avx(auVar40._0_16_);
      auVar49 = ZEXT856(0);
      c.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      c.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      c.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      local_a50 = local_a60;
      local_a48 = local_a58;
      local_a20 = local_a60;
      local_a18 = local_a58;
      PVar50 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),c);
      local_a68 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar41._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar41._8_56_ = auVar49;
      local_a70 = vmovlpd_avx(auVar41._0_16_);
      local_a88 = local_38;
      local_a90 = local_40;
      local_a98 = local_38;
      local_aa0 = local_40;
      auVar49 = ZEXT856(0);
      t_01.y = in_stack_fffffffffffff2a4;
      t_01.x = in_stack_fffffffffffff2a0;
      t_01.z = in_stack_fffffffffffff2a8;
      local_9d0 = local_a70;
      local_9c8 = local_a68;
      PVar50 = Abs<pbrt::Point3,float>(t_01);
      local_ab8 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar42._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar42._8_56_ = auVar49;
      local_ac0 = vmovlpd_avx(auVar42._0_16_);
      auVar49 = ZEXT856(0);
      c_00.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      c_00.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      c_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      local_ab0 = local_ac0;
      local_aa8 = local_ab8;
      local_a80 = local_ac0;
      local_a78 = local_ab8;
      PVar50 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),c_00);
      local_ac8 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar43._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar43._8_56_ = auVar49;
      local_ad0 = vmovlpd_avx(auVar43._0_16_);
      local_ae8 = local_50;
      local_af0 = local_58;
      local_af8 = local_50;
      local_b00 = local_58;
      auVar49 = ZEXT856(0);
      t_02.y = in_stack_fffffffffffff2a4;
      t_02.x = in_stack_fffffffffffff2a0;
      t_02.z = in_stack_fffffffffffff2a8;
      local_9c0 = local_ad0;
      local_9b8 = local_ac8;
      PVar50 = Abs<pbrt::Point3,float>(t_02);
      local_b18 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar44._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar44._8_56_ = auVar49;
      local_b20 = vmovlpd_avx(auVar44._0_16_);
      auVar49 = ZEXT856(0);
      c_01.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2a4;
      c_01.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2a0;
      c_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2a8;
      local_b10 = local_b20;
      local_b08 = local_b18;
      local_ae0 = local_b20;
      local_ad8 = local_b18;
      PVar50 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff28c,in_stack_fffffffffffff288),c_01);
      local_b28 = PVar50.super_Tuple3<pbrt::Point3,_float>.z;
      auVar45._0_8_ = PVar50.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar45._8_56_ = auVar49;
      local_b30 = vmovlpd_avx(auVar45._0_16_);
      local_9b0 = local_b30;
      local_9a8 = local_b28;
      dVar8 = pbrt::gamma(auVar45._0_8_);
      uVar6 = SUB84(dVar8,0);
      local_b60 = local_9a8;
      local_b68 = local_9b0;
      local_b70 = local_9a8;
      local_b78 = local_9b0;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff290;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff28c;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff294;
      Vector3<float>::Vector3<float>((Vector3<float> *)0x585ea0,p_00);
      auVar49 = (undefined1  [56])0x0;
      local_b48 = local_b54;
      local_b50 = local_b5c;
      local_b80 = local_b54;
      local_b88 = local_b5c;
      t_03.y = in_stack_fffffffffffff2ac;
      t_03.x = in_stack_fffffffffffff2a8;
      t_03.z = in_stack_fffffffffffff2b0;
      VVar51 = pbrt::operator*(in_stack_fffffffffffff294,t_03);
      local_b90 = VVar51.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar46._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar46._8_56_ = auVar49;
      local_b98 = vmovlpd_avx(auVar46._0_16_);
      this_00 = &local_c08;
      p_10.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff2cc;
      p_10.super_Tuple3<pbrt::Point3,_float>.x = in_stack_fffffffffffff2c8;
      p_10.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff2d0;
      e.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      e.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      e.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      local_b40 = local_b98;
      local_b38 = local_b90;
      Point3fi::Point3fi((Point3fi *)CONCAT44(in_stack_fffffffffffff294,in_stack_fffffffffffff290),
                         p_10,e);
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = in_stack_fffffffffffff2ac;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffff2a8;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff2b0;
      uv_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff294;
      uv_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff290;
      Interaction::Interaction
                (this_00,(Point3fi *)CONCAT44(uVar6,in_stack_fffffffffffff280),n_00,uv_00);
      auVar49 = ZEXT856(0);
      v_14.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2c8;
      v_14.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff2c0;
      w_04.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2a8;
      w_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a4;
      w_04.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2ac;
      FVar53 = local_5c;
      VVar51 = Cross<float>(v_14,w_04);
      auVar47._0_8_ = VVar51.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar47._8_56_ = auVar49;
      vmovlpd_avx(auVar47._0_16_);
      v_07.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff2ac;
      v_07.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff2a8;
      v_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff2b0;
      tVar7 = Length<float>(v_07);
      local_ba0 = FVar53 / tVar7;
      pstd::optional<pbrt::ShapeSample>::optional
                ((optional<pbrt::ShapeSample> *)CONCAT44(uVar6,in_stack_fffffffffffff280),
                 in_stack_fffffffffffff278);
      return in_RDI;
    }
  }
  memset((void *)CONCAT44(uStack_cf4,fVar56),0,0x60);
  pstd::optional<pbrt::ShapeSample>::optional
            ((optional<pbrt::ShapeSample> *)CONCAT44(uStack_cf4,fVar56));
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU pstd::optional<ShapeSample> BilinearPatch::Sample(Point2f u) const {
    const BilinearPatchMesh *mesh = GetMesh();
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    Point3f p00 = mesh->p[v[0]], p10 = mesh->p[v[1]];
    Point3f p01 = mesh->p[v[2]], p11 = mesh->p[v[3]];

    // Sample bilinear patch parametric $(u,v)$ coordinates
    Float pdf = 1;
    Point2f uv;
    if (mesh->imageDistribution)
        uv = mesh->imageDistribution->Sample(u, &pdf);
    else if (!IsRectangle(mesh)) {
        // Sample patch $(u,v)$ with approximate uniform area sampling
        // Initialize _w_ array with differential area at bilinear patch corners
        pstd::array<Float, 4> w = {
            Length(Cross(p10 - p00, p01 - p00)), Length(Cross(p10 - p00, p11 - p10)),
            Length(Cross(p01 - p00, p11 - p01)), Length(Cross(p11 - p10, p11 - p01))};

        uv = SampleBilinear(u, w);
        pdf = BilinearPDF(uv, w);

    } else
        uv = u;

    // Compute bilinear patch geometric quantities at sampled $(u,v)$
    // Compute $\pt{}$, $\dpdu$, and $\dpdv$ for sampled $(u,v)$
    Point3f pu0 = Lerp(uv[1], p00, p01), pu1 = Lerp(uv[1], p10, p11);
    Point3f p = Lerp(uv[0], pu0, pu1);
    Vector3f dpdu = pu1 - pu0;
    Vector3f dpdv = Lerp(uv[0], p01, p11) - Lerp(uv[0], p00, p10);
    if (LengthSquared(dpdu) == 0 || LengthSquared(dpdv) == 0)
        return {};

    Point2f st = uv;
    if (mesh->uv) {
        // Compute texture coordinates for bilinear patch intersection point
        Point2f uv00 = mesh->uv[v[0]], uv10 = mesh->uv[v[1]];
        Point2f uv01 = mesh->uv[v[2]], uv11 = mesh->uv[v[3]];
        st = Lerp(uv[0], Lerp(uv[1], uv00, uv01), Lerp(uv[1], uv10, uv11));
    }
    // Compute surface normal for sampled bilinear patch $(u,v)$
    Normal3f n = Normal3f(Normalize(Cross(dpdu, dpdv)));
    // Flip normal at sampled $(u,v)$ if necessary
    if (mesh->n) {
        Normal3f n00 = mesh->n[v[0]], n10 = mesh->n[v[1]];
        Normal3f n01 = mesh->n[v[2]], n11 = mesh->n[v[3]];
        Normal3f ns = Lerp(uv[0], Lerp(uv[1], n00, n01), Lerp(uv[1], n10, n11));
        n = FaceForward(n, ns);
    } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
        n = -n;

    // Compute _pError_ for sampled bilinear patch $(u,v)$
    Point3f pAbsSum = Abs(p00) + Abs(p01) + Abs(p10) + Abs(p11);
    Vector3f pError = gamma(6) * Vector3f(pAbsSum);

    // Return _ShapeSample_ for sampled bilinear patch point
    return ShapeSample{Interaction(Point3fi(p, pError), n, st),
                       pdf / Length(Cross(dpdu, dpdv))};
}